

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParticleTests.cpp
# Opt level: O3

void __thiscall
ParticleTest_DefaultConstructor_Test<pica::Particle<(pica::Dimension)3>_>::
~ParticleTest_DefaultConstructor_Test
          (ParticleTest_DefaultConstructor_Test<pica::Particle<(pica::Dimension)3>_> *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x20);
  return;
}

Assistant:

TYPED_TEST(ParticleTest, DefaultConstructor)
{
    typedef typename ParticleTest<TypeParam>::Particle ParticleType;
    typedef typename ParticleTest<TypeParam>::PositionType PositionType;
    typedef typename ParticleTest<TypeParam>::MomentumType MomentumType;
    typedef typename ParticleTest<TypeParam>::GammaType GammaType;
    typedef typename ParticleTest<TypeParam>::FactorType FactorType;

    ParticleType particle;
    ASSERT_EQ_VECTOR(PositionType(), particle.getPosition(), this->dimension);
    ASSERT_EQ_VECTOR(MomentumType(), particle.getMomentum(), this->momentumDimension);
    ASSERT_EQ_VECTOR(MomentumType(), particle.getVelocity(), this->momentumDimension);
    ASSERT_EQ(static_cast<FactorType>(1.0), particle.getFactor());
    ASSERT_EQ(static_cast<GammaType>(1.0), particle.getGamma());
}